

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ReduceMaxLayerParams::ByteSizeLong(ReduceMaxLayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong *puVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar3 = (this->axes_).current_size_;
  uVar9 = 0;
  if ((int)uVar3 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->axes_,(int)uVar9);
      lVar2 = 0x3f;
      if ((*puVar4 | 1) != 0) {
        for (; (*puVar4 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar3 != uVar8);
    if (lVar7 == 0) {
      lVar7 = 0;
      uVar9 = 0;
    }
    else if ((int)(uint)lVar7 < 0) {
      uVar9 = 0xb;
    }
    else {
      uVar3 = (uint)lVar7 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar9 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_axes_cached_byte_size_ = (int)lVar7;
  sVar6 = uVar9 + lVar7 + 2;
  if (this->keepdims_ == false) {
    sVar6 = uVar9 + lVar7;
  }
  sVar5 = sVar6 + 2;
  if (this->reduceall_ == false) {
    sVar5 = sVar6;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t ReduceMaxLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReduceMaxLayerParams)
  size_t total_size = 0;

  // repeated int64 axes = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->axes_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _axes_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bool keepDims = 2;
  if (this->keepdims() != 0) {
    total_size += 1 + 1;
  }

  // bool reduceAll = 3;
  if (this->reduceall() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}